

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

void eval_residual(double *coeffs,double *rgb,double *residual)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int j_1;
  int j;
  double s;
  int i_1;
  double x;
  double lambda;
  int i;
  double out [3];
  int local_68;
  int local_64;
  double in_stack_ffffffffffffffa0;
  int local_54;
  ulong local_50;
  int local_3c;
  double local_38 [3];
  double *in_stack_ffffffffffffffe0;
  
  memset(local_38,0,0x18);
  for (local_3c = 0; local_3c < 0x11b; local_3c = local_3c + 1) {
    auVar1._0_8_ = (lambda_tbl[local_3c] - 360.0) / 470.0;
    local_50 = 0;
    for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_50;
      auVar1._8_8_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(in_RDI + (long)local_54 * 8);
      auVar2 = vfmadd213sd_fma(auVar1,auVar3,auVar5);
      local_50 = auVar2._0_8_;
    }
    auVar2._0_8_ = sigmoid(in_stack_ffffffffffffffa0);
    for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = rgb_tbl[local_64][local_3c];
      auVar2._8_8_ = 0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_38[local_64];
      auVar1 = vfmadd213sd_fma(auVar2,auVar4,auVar6);
      local_38[local_64] = auVar1._0_8_;
    }
    in_stack_ffffffffffffffa0 = auVar2._0_8_;
  }
  cie_lab(in_stack_ffffffffffffffe0);
  *in_RDX = *in_RSI;
  in_RDX[1] = in_RSI[1];
  in_RDX[2] = in_RSI[2];
  cie_lab(in_stack_ffffffffffffffe0);
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    in_RDX[local_68] = (double)in_RDX[local_68] - local_38[local_68];
  }
  return;
}

Assistant:

void eval_residual(const double *coeffs, const double *rgb, double *residual) {
    double out[3] = {0.0, 0.0, 0.0};

    for (int i = 0; i < CIE_FINE_SAMPLES; ++i) {
        /* Scale lambda to 0..1 range */
        double lambda =
            (lambda_tbl[i] - CIE_LAMBDA_MIN) / (CIE_LAMBDA_MAX - CIE_LAMBDA_MIN);

        /* Polynomial */
        double x = 0.0;
        for (int i = 0; i < 3; ++i)
            x = x * lambda + coeffs[i];

        /* Sigmoid */
        double s = sigmoid(x);

        /* Integrate against precomputed curves */
        for (int j = 0; j < 3; ++j)
            out[j] += rgb_tbl[j][i] * s;
    }
    cie_lab(out);
    memcpy(residual, rgb, sizeof(double) * 3);
    cie_lab(residual);

    for (int j = 0; j < 3; ++j)
        residual[j] -= out[j];
}